

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenTableGrowSetTable(BinaryenExpressionRef expr,char *table)

{
  Name local_28;
  
  if (expr->_id != TableGrowId) {
    __assert_fail("expression->is<TableGrow>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xa00,"void BinaryenTableGrowSetTable(BinaryenExpressionRef, const char *)");
  }
  if (table != (char *)0x0) {
    wasm::Name::Name(&local_28,table);
    *(size_t *)(expr + 1) = local_28.super_IString.str._M_len;
    expr[1].type.id = (uintptr_t)local_28.super_IString.str._M_str;
    return;
  }
  __assert_fail("table",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xa01,"void BinaryenTableGrowSetTable(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenTableGrowSetTable(BinaryenExpressionRef expr, const char* table) {
  auto* expression = (Expression*)expr;
  assert(expression->is<TableGrow>());
  assert(table);
  static_cast<TableGrow*>(expression)->table = table;
}